

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<8,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float afStack_2c [5];
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar5 = evalCtx->in[0].m_data[0];
    fVar4 = evalCtx->in[0].m_data[1];
    fVar3 = evalCtx->in[1].m_data[0];
    fVar2 = evalCtx->in[1].m_data[1];
  }
  else {
    fVar5 = -0.1;
    fVar4 = -0.2;
    fVar3 = 1.0;
    fVar2 = 0.0;
  }
  afStack_2c[2] = fVar2 * fVar5 - fVar3 * fVar4;
  afStack_2c[3] = afStack_2c[2];
  afStack_2c[4] = afStack_2c[2];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = afStack_2c[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = Vec3(determinant(in0));
	}